

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

int qRegisterNormalizedMetaTypeImplementation<QDnsTlsAssociationRecord::Selector>
              (QByteArray *normalizedTypeName)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  char *local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr =
       &QtPrivate::QMetaTypeInterfaceWrapper<QDnsTlsAssociationRecord::Selector>::metaType;
  iVar2 = QMetaType::registerHelper(&local_28);
  if (local_28.d_ptr == (InterfaceType *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = (local_28.d_ptr)->name;
  }
  bVar1 = operator!=(normalizedTypeName,&local_30);
  if (bVar1) {
    QMetaType::registerNormalizedTypedef(normalizedTypeName,local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int qRegisterNormalizedMetaTypeImplementation(const QT_PREPEND_NAMESPACE(QByteArray) &normalizedTypeName)
{
#ifndef QT_NO_QOBJECT
    Q_ASSERT_X(normalizedTypeName == QMetaObject::normalizedType(normalizedTypeName.constData()),
               "qRegisterNormalizedMetaType",
               "qRegisterNormalizedMetaType was called with a not normalized type name, "
               "please call qRegisterMetaType instead.");
#endif

    const QMetaType metaType = QMetaType::fromType<T>();
    const int id = metaType.id();

    QtPrivate::SequentialContainerTransformationHelper<T>::registerConverter();
    QtPrivate::SequentialContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerConverter();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::MetaTypePairHelper<T>::registerConverter();
    QtPrivate::MetaTypeSmartPointerHelper<T>::registerConverter();
#if QT_CONFIG(future)
    QtPrivate::MetaTypeQFutureHelper<T>::registerConverter();
#endif

    if (normalizedTypeName != metaType.name())
        QMetaType::registerNormalizedTypedef(normalizedTypeName, metaType);

    return id;
}